

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posixcrashhandler.cpp
# Opt level: O3

void __thiscall Debug::PosixCrashHandler::teardown(PosixCrashHandler *this)

{
  long lVar1;
  sigset_t *psVar2;
  ulong *puVar3;
  byte bVar4;
  sigaction sa;
  sigset_t mysigset;
  _union_1457 local_120;
  ulong local_118 [16];
  undefined4 local_98;
  sigset_t local_88;
  
  bVar4 = 0;
  sigemptyset(&local_88);
  local_120.sa_handler = (__sighandler_t)0x0;
  psVar2 = &local_88;
  puVar3 = local_118;
  for (lVar1 = 0x10; lVar1 != 0; lVar1 = lVar1 + -1) {
    *puVar3 = psVar2->__val[0];
    psVar2 = (sigset_t *)((long)psVar2 + ((ulong)bVar4 * -2 + 1) * 8);
    puVar3 = puVar3 + (ulong)bVar4 * -2 + 1;
  }
  local_98 = 0;
  sigaction(6,(sigaction *)&local_120,(sigaction *)0x0);
  sigaction(0xb,(sigaction *)&local_120,(sigaction *)0x0);
  sigaction(7,(sigaction *)&local_120,(sigaction *)0x0);
  sigaction(4,(sigaction *)&local_120,(sigaction *)0x0);
  sigaction(8,(sigaction *)&local_120,(sigaction *)0x0);
  sigaction(0xd,(sigaction *)&local_120,(sigaction *)0x0);
  sigaction(0xf,(sigaction *)&local_120,(sigaction *)0x0);
  return;
}

Assistant:

void PosixCrashHandler::teardown() {
        struct sigaction sa;
        sigset_t mysigset;
        
        sigemptyset(&mysigset);
        
        sa.sa_handler = SIG_DFL;
        sa.sa_mask = mysigset;
        sa.sa_flags = 0;

        sigaction( SIGABRT, &sa, NULL );
        sigaction( SIGSEGV, &sa, NULL );
        sigaction( SIGBUS,  &sa, NULL );
        sigaction( SIGILL,  &sa, NULL );
        sigaction( SIGFPE,  &sa, NULL );
        sigaction( SIGPIPE, &sa, NULL );
        sigaction( SIGTERM, &sa, NULL );
    }